

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O1

void secp256k1_scratch_space_destroy(secp256k1_context *ctx,secp256k1_scratch_space *scratch)

{
  long lVar1;
  int iVar2;
  
  if (scratch == (secp256k1_scratch_space *)0x0) {
    return;
  }
  lVar1 = 0;
  do {
    iVar2 = (uint)scratch->magic[lVar1] - (uint)(byte)"scratch"[lVar1];
    if (scratch->magic[lVar1] != "scratch"[lVar1]) goto LAB_00117094;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  iVar2 = 0;
LAB_00117094:
  if (iVar2 == 0) {
    scratch->magic[0] = '\0';
    scratch->magic[1] = '\0';
    scratch->magic[2] = '\0';
    scratch->magic[3] = '\0';
    scratch->magic[4] = '\0';
    scratch->magic[5] = '\0';
    scratch->magic[6] = '\0';
    scratch->magic[7] = '\0';
    free(scratch);
    return;
  }
  (*(ctx->error_callback).fn)("invalid scratch space",(ctx->error_callback).data);
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}